

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,qsizetype count,char ch)

{
  long lVar1;
  char *pcVar2;
  size_t __n;
  
  if (0 < count && -1 < i) {
    lVar1 = (this->d).size;
    if (i < lVar1) {
      QtPrivate::QPodArrayOps<char>::insert((QPodArrayOps<char> *)this,i,count,ch);
    }
    else {
      QArrayDataPointer<char>::detachAndGrow
                (&this->d,GrowsAtEnd,(count + i) - lVar1,(char **)0x0,(QArrayDataPointer<char> *)0x0
                );
      pcVar2 = (this->d).ptr;
      if (pcVar2 == (char *)0x0) {
        qBadAlloc();
      }
      lVar1 = (this->d).size;
      __n = i - lVar1;
      if (__n != 0) {
        (this->d).size = i;
        memset(pcVar2 + lVar1,0x20,__n);
      }
      if (count != 0) {
        lVar1 = (this->d).size;
        (this->d).size = lVar1 + count;
        memset((this->d).ptr + lVar1,(uint)(byte)ch,count);
      }
    }
    (this->d).ptr[(this->d).size] = '\0';
  }
  return this;
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, qsizetype count, char ch)
{
    if (i < 0 || count <= 0)
        return *this;

    if (i >= d->size) {
        // handle this specially, as QArrayDataOps::insert() doesn't handle out of bounds positions
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + count, nullptr, nullptr);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(count, ch);
        d.data()[d.size] = '\0';
        return *this;
    }

    d->insert(i, count, ch);
    d.data()[d.size] = '\0';
    return *this;
}